

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

void lzma_check_init(lzma_check_state *check,lzma_check type)

{
  uint32_t *puVar1;
  
  if (type == LZMA_CHECK_SHA256) {
    puVar1 = (uint32_t *)((long)&check->state + 0x10);
    puVar1[0] = 0x510e527f;
    puVar1[1] = 0x9b05688c;
    puVar1 = (uint32_t *)((long)&check->state + 0x18);
    puVar1[0] = 0x1f83d9ab;
    puVar1[1] = 0x5be0cd19;
    (check->state).crc64 = 0xbb67ae856a09e667;
    puVar1 = (uint32_t *)((long)&check->state + 8);
    puVar1[0] = 0x3c6ef372;
    puVar1[1] = 0xa54ff53a;
    (check->state).sha256.size = 0;
    return;
  }
  if (type == LZMA_CHECK_CRC64) {
    (check->state).crc64 = 0;
  }
  else if (type == LZMA_CHECK_CRC32) {
    (check->state).crc32 = 0;
    return;
  }
  return;
}

Assistant:

extern void
lzma_check_init(lzma_check_state *check, lzma_check type)
{
	switch (type) {
	case LZMA_CHECK_NONE:
		break;

#ifdef HAVE_CHECK_CRC32
	case LZMA_CHECK_CRC32:
		check->state.crc32 = 0;
		break;
#endif

#ifdef HAVE_CHECK_CRC64
	case LZMA_CHECK_CRC64:
		check->state.crc64 = 0;
		break;
#endif

#ifdef HAVE_CHECK_SHA256
	case LZMA_CHECK_SHA256:
		lzma_sha256_init(check);
		break;
#endif

	default:
		break;
	}

	return;
}